

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortFun.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  int tmpVar;
  int iVar4;
  int iVar5;
  int tmpVar_1;
  int iVar6;
  int iVar7;
  int iVar8;
  int b;
  int a;
  int c;
  int local_2c;
  int local_28;
  int local_24;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int a: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int b: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter int c: ",0x14);
  std::istream::operator>>((istream *)&std::cin,&local_24);
  iVar1 = local_28;
  iVar4 = local_2c;
  iVar6 = local_24;
  iVar7 = local_28;
  do {
    iVar5 = iVar7;
    iVar8 = iVar4;
    if (iVar4 < iVar7) {
      iVar1 = iVar4;
      iVar5 = iVar4;
      iVar8 = iVar7;
      local_2c = iVar7;
      local_28 = iVar4;
    }
    iVar4 = iVar8;
    iVar7 = iVar6;
    if (iVar6 < iVar8) {
      iVar5 = iVar1;
      iVar4 = iVar6;
      iVar7 = iVar8;
      local_2c = iVar6;
      local_24 = iVar8;
    }
    iVar6 = iVar7;
    iVar7 = iVar5;
  } while (iVar6 < iVar4 || iVar4 < iVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sorted values: ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar1 = local_24;
  iVar4 = local_28;
  iVar6 = local_2c;
  iVar7 = local_24;
  do {
    iVar5 = iVar7;
    iVar8 = iVar4;
    if (iVar4 < iVar7) {
      iVar1 = iVar4;
      iVar5 = iVar4;
      iVar8 = iVar7;
      local_28 = iVar7;
      local_24 = iVar4;
    }
    iVar4 = iVar8;
    iVar7 = iVar6;
    if (iVar6 < iVar8) {
      iVar5 = iVar1;
      iVar4 = iVar6;
      iVar7 = iVar8;
      local_2c = iVar8;
      local_28 = iVar6;
    }
    iVar6 = iVar7;
    iVar7 = iVar5;
  } while (iVar6 < iVar4 || iVar4 < iVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sorted values (c, a, b): ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,local_2c);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    int a;
    int b;
    int c;

    cout << "Please enter int a: ";
    cin >> a;
    cout << "Please enter int b: ";
    cin >> b;
    cout << "Please enter int c: ";
    cin >> c;

    sort3(a, b, c);

    cout << "Sorted values: " << a << " " << b << " " << c << endl;

    sort3(c, a, b);

    cout << "Sorted values (c, a, b): " << c << " " << a << " " << b << endl;

}